

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O1

void __thiscall ki::dml::value_error::value_error(value_error *this,string *message)

{
  pointer pcVar1;
  long *local_38 [2];
  long local_28 [2];
  
  pcVar1 = (message->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + message->_M_string_length);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)local_38);
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_0015cd28;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  *(undefined ***)&this->super_runtime_error = &PTR__runtime_error_0015cd00;
  return;
}

Assistant:

value_error(std::string message) : runtime_error(message) { }